

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O0

Position * iDynTree::Position::compose(Position *op1,Position *op2)

{
  double *pdVar1;
  VectorFixSize<3U> *in_RDX;
  VectorFixSize<3U> *in_RSI;
  VectorFixSize<3U> *in_RDI;
  double dVar2;
  double dVar3;
  Position *result;
  
  Position((Position *)0x6c33f5);
  dVar2 = VectorFixSize<3U>::operator()(in_RSI,0);
  dVar3 = VectorFixSize<3U>::operator()(in_RDX,0);
  pdVar1 = VectorFixSize<3U>::operator()(in_RDI,0);
  *pdVar1 = dVar2 + dVar3;
  dVar2 = VectorFixSize<3U>::operator()(in_RSI,1);
  dVar3 = VectorFixSize<3U>::operator()(in_RDX,1);
  pdVar1 = VectorFixSize<3U>::operator()(in_RDI,1);
  *pdVar1 = dVar2 + dVar3;
  dVar2 = VectorFixSize<3U>::operator()(in_RSI,2);
  dVar3 = VectorFixSize<3U>::operator()(in_RDX,2);
  pdVar1 = VectorFixSize<3U>::operator()(in_RDI,2);
  *pdVar1 = dVar2 + dVar3;
  return (Position *)in_RDI;
}

Assistant:

Position Position::compose(const Position& op1, const Position& op2)
    {
        Position result;
        result(0) = op1(0) + op2(0);
        result(1) = op1(1) + op2(1);
        result(2) = op1(2) + op2(2);
        return result;
    }